

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofiletocsv.cpp
# Opt level: O2

void fmprofiletocsv::doit(bool skipheader,bool step)

{
  size_t sVar1;
  undefined7 in_register_00000031;
  fm_profile q;
  
  if ((int)CONCAT71(in_register_00000031,step) != 0) {
    dostep(skipheader);
    return;
  }
  if (!skipheader) {
    printf("profile_id,calcrule_id,deductible1,deductible2,");
    printf("deductible3,attachment1,limit1,share1,share2,");
    puts("share3");
  }
  q.share2 = 0.0;
  q.share3 = 0.0;
  q.deductible3 = 0.0;
  q.attachment = 0.0;
  q.limit = 0.0;
  q.share1 = 0.0;
  q.profile_id = 0;
  q.calcrule_id = 0;
  q.deductible1 = 0.0;
  q.deductible2 = 0.0;
  sVar1 = fread(&q,0x28,1,_stdin);
  while (sVar1 != 0) {
    printf("%d, %d, %f, %f, %f, %f, %f, %f, %f, %f\n",SUB84((double)q.deductible1,0),
           (double)q.deductible2,(double)q.deductible3,(double)q.attachment,(double)q.limit,
           (double)q.share1,(double)q.share2,(double)q.share3,q._0_8_ & 0xffffffff,
           (ulong)q._0_8_ >> 0x20);
    sVar1 = fread(&q,0x28,1,_stdin);
  }
  return;
}

Assistant:

void doit(bool skipheader, bool step) {
		if (step) {
			dostep(skipheader);
			return;
		}
        if (skipheader == false) {
            printf("profile_id,calcrule_id,deductible1,deductible2,");
            printf("deductible3,attachment1,limit1,share1,share2,");
            printf("share3\n");
        }

        fm_profile q;
        size_t i = fread(&q, sizeof(q), 1, stdin);
        while (i != 0) {
            printf("%d, %d, %f, %f, %f, %f, %f, %f, %f, %f\n", q.profile_id,
                   q.calcrule_id, q.deductible1, q.deductible2, q.deductible3,
                   q.attachment, q.limit, q.share1, q.share2, q.share3);

            i = fread(&q, sizeof(q), 1, stdin);
        }
    }